

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_right_delim_join.cpp
# Opt level: O3

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalRightDelimJoin::GetGlobalSinkState
          (PhysicalRightDelimJoin *this,ClientContext *context)

{
  __buckets_ptr pp_Var1;
  __node_base_ptr p_Var2;
  size_type sVar3;
  long *plVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr in_RAX;
  _func_int **pp_Var6;
  type state;
  __node_base_ptr local_28;
  
  local_28 = in_RAX;
  pp_Var6 = (_func_int **)operator_new(0x58);
  *pp_Var6 = (_func_int *)0x0;
  pp_Var6[1] = (_func_int *)0x0;
  pp_Var6[2] = (_func_int *)0x0;
  pp_Var6[3] = (_func_int *)0x0;
  pp_Var6[4] = (_func_int *)0x0;
  pp_Var6[5] = (_func_int *)0x0;
  pp_Var6[6] = (_func_int *)0x0;
  pp_Var6[7] = (_func_int *)0x0;
  pp_Var6[8] = (_func_int *)0x0;
  pp_Var6[9] = (_func_int *)0x0;
  pp_Var6[10] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var6 + 1) = 1;
  *(undefined1 *)(pp_Var6 + 10) = 0;
  *pp_Var6 = (_func_int *)&PTR__GlobalSinkState_0245c528;
  (*(code *)(*(context->config).profiler_settings._M_h._M_buckets)[0x20]._M_nxt)(&local_28);
  p_Var5 = local_28;
  pp_Var1 = (context->config).profiler_settings._M_h._M_buckets;
  local_28 = (__node_base_ptr)0x0;
  p_Var2 = pp_Var1[9];
  pp_Var1[9] = p_Var5;
  if (p_Var2 != (__node_base_ptr)0x0) {
    (*(code *)p_Var2->_M_nxt[1]._M_nxt)();
    if (local_28 != (__node_base_ptr)0x0) {
      (*(code *)local_28->_M_nxt[1]._M_nxt)();
    }
  }
  (**(code **)(*(long *)(context->config).profiler_settings._M_h._M_bucket_count + 0x100))
            (&local_28);
  p_Var2 = local_28;
  sVar3 = (context->config).profiler_settings._M_h._M_bucket_count;
  local_28 = (__node_base_ptr)0x0;
  plVar4 = *(long **)(sVar3 + 0x48);
  *(__node_base_ptr *)(sVar3 + 0x48) = p_Var2;
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 8))();
    if (local_28 != (__node_base_ptr)0x0) {
      (*(code *)local_28->_M_nxt[1]._M_nxt)();
    }
  }
  if (8 < (context->config).profiler_settings._M_h._M_element_count -
          (long)(context->config).profiler_settings._M_h._M_before_begin._M_nxt) {
    state = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
            ::operator*((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                         *)((context->config).profiler_settings._M_h._M_bucket_count + 0x48));
    PhysicalHashAggregate::SetMultiScan(state);
  }
  (this->super_PhysicalDelimJoin).super_PhysicalOperator._vptr_PhysicalOperator = pp_Var6;
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)this;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalRightDelimJoin::GetGlobalSinkState(ClientContext &context) const {
	auto state = make_uniq<RightDelimJoinGlobalState>();
	join.sink_state = join.GetGlobalSinkState(context);
	distinct.sink_state = distinct.GetGlobalSinkState(context);
	if (delim_scans.size() > 1) {
		PhysicalHashAggregate::SetMultiScan(*distinct.sink_state);
	}
	return std::move(state);
}